

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

int __thiscall baryonyx::itm::shared_subvector::init(shared_subvector *this,EVP_PKEY_CTX *ctx)

{
  undefined4 extraout_EAX;
  int iVar1;
  uint uVar2;
  
  uVar2 = (uint)ctx;
  if (uVar2 != 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->m_container,0);
    this->m_element_size = uVar2;
    this->m_free_list_head = 0xffffffff;
    return CONCAT31((int3)((uint)extraout_EAX >> 8),3 < uVar2);
  }
  iVar1 = init((EVP_PKEY_CTX *)this);
  __clang_call_terminate(iVar1);
}

Assistant:

[[nodiscard]] bool init(size_type element_size) noexcept
    {
        bx_assert(element_size > 0);

        m_container.resize(0);
        m_element_size = element_size;
        m_free_list_head = npos;

        if (sizeof(size_type) > (element_size * sizeof(value_type)))
            return false;

        return true;
    }